

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.cpp
# Opt level: O0

unique_pointer<const_void> __thiscall
pstore::database::get_spanningu(database *this,address addr,size_t size,bool initialized)

{
  pointer puVar1;
  undefined7 in_register_00000009;
  _Head_base<0UL,_const_void_*,_false> extraout_RDX;
  byte in_R8B;
  unique_pointer<const_void> uVar2;
  _func_void_void_ptr *local_70 [4];
  size_t local_50;
  _func_void_uchar_ptr *local_48;
  undefined1 local_40 [8];
  unique_pointer<std::uint8_t> result;
  bool initialized_local;
  size_t size_local;
  database *this_local;
  address addr_local;
  
  result._M_t.super___uniq_ptr_impl<unsigned_char,_void_(*)(unsigned_char_*)>._M_t.
  super__Tuple_impl<0UL,_unsigned_char_*,_void_(*)(unsigned_char_*)>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl._7_1_ = in_R8B & 1;
  puVar1 = (pointer)operator_new__(CONCAT71(in_register_00000009,initialized));
  local_48 = deleter<unsigned_char>;
  std::unique_ptr<unsigned_char,void(*)(unsigned_char*)>::unique_ptr<void(*)(unsigned_char*),void>
            ((unique_ptr<unsigned_char,void(*)(unsigned_char*)> *)local_40,puVar1,&local_48);
  if ((result._M_t.super___uniq_ptr_impl<unsigned_char,_void_(*)(unsigned_char_*)>._M_t.
       super__Tuple_impl<0UL,_unsigned_char_*,_void_(*)(unsigned_char_*)>.
       super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl._7_1_ & 1) != 0) {
    local_50 = size;
    puVar1 = std::unique_ptr<unsigned_char,_void_(*)(unsigned_char_*)>::get
                       ((unique_ptr<unsigned_char,_void_(*)(unsigned_char_*)> *)local_40);
    pstore::storage::
    copy<pstore::storage::copy_from_store_traits,pstore::database::get_spanningu(pstore::address,unsigned_long,bool)const::__0>
              ((storage *)(addr.a_ + 8),local_50,CONCAT71(in_register_00000009,initialized),puVar1);
  }
  puVar1 = std::unique_ptr<unsigned_char,_void_(*)(unsigned_char_*)>::release
                     ((unique_ptr<unsigned_char,_void_(*)(unsigned_char_*)> *)local_40);
  local_70[0] = deleter<void_const>;
  std::unique_ptr<void_const,void(*)(void_const*)>::unique_ptr<void(*)(void_const*),void>
            ((unique_ptr<void_const,void(*)(void_const*)> *)this,puVar1,local_70);
  std::unique_ptr<unsigned_char,_void_(*)(unsigned_char_*)>::~unique_ptr
            ((unique_ptr<unsigned_char,_void_(*)(unsigned_char_*)> *)local_40);
  uVar2._M_t.super___uniq_ptr_impl<const_void,_void_(*)(const_void_*)>._M_t.
  super__Tuple_impl<0UL,_const_void_*,_void_(*)(const_void_*)>.
  super__Head_base<0UL,_const_void_*,_false>._M_head_impl = extraout_RDX._M_head_impl;
  uVar2._M_t.super___uniq_ptr_impl<const_void,_void_(*)(const_void_*)>._M_t.
  super__Tuple_impl<0UL,_const_void_*,_void_(*)(const_void_*)>.
  super__Tuple_impl<1UL,_void_(*)(const_void_*)>.
  super__Head_base<1UL,_void_(*)(const_void_*),_false>._M_head_impl =
       (_Head_base<1UL,_void_(*)(const_void_*),_false>)
       (_Head_base<1UL,_void_(*)(const_void_*),_false>)this;
  return (unique_pointer<const_void>)
         uVar2._M_t.super___uniq_ptr_impl<const_void,_void_(*)(const_void_*)>._M_t.
         super__Tuple_impl<0UL,_const_void_*,_void_(*)(const_void_*)>;
}

Assistant:

auto database::get_spanningu (address const addr, std::size_t const size,
                                  bool const initialized) const -> unique_pointer<void const> {
        // Create the memory block that we'll be returning, attaching a suitable deleter
        // which will be responsible for copying the data back to the store (if we're providing
        // a writable pointer).
        unique_pointer<std::uint8_t> result{new std::uint8_t[size], deleter};
        if (initialized) {
            // Copy from the data store's regions to the newly allocated memory block.
            storage_.copy<storage::copy_from_store_traits> (
                addr, size, result.get (),
                [] (std::uint8_t const * const src, std::uint8_t * const dest,
                    std::size_t const n) { std::memcpy (dest, src, n); });
        }
        return {result.release (), deleter};
    }